

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O3

void qt_format_text(QFont *fnt,QRectF *_r,int tf,QTextOption *option,QString *str,QRectF *brect,
                   int tabstops,int *ta,int tabarraylen,QPainter *painter)

{
  __uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_> _Var1;
  bool bVar2;
  undefined1 *puVar3;
  QTextLayout this;
  char cVar4;
  char16_t cVar5;
  QFixed QVar6;
  int iVar7;
  pointer pQVar8;
  uint uVar9;
  uint uVar10;
  uint uVar12;
  char16_t *pcVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  char16_t *pcVar19;
  long lVar20;
  int iVar21;
  long in_FS_OFFSET;
  bool bVar22;
  qreal qVar23;
  double dVar24;
  undefined1 *puVar25;
  QTextLine QVar26;
  QFontMetricsF fm;
  int local_2b3c;
  qreal local_2b38;
  double local_2b28;
  double local_2b18;
  QPointF local_2aa8;
  QTextLine local_2a98;
  QTextLayout local_2a80;
  QString local_2a78;
  QArrayDataPointer<QTextLayout::FormatRange> local_2a58;
  QArrayData *local_2a38;
  char16_t *local_2a30;
  long local_2a28;
  QFontMetricsF local_2a20;
  QRectF local_2a18;
  undefined1 local_29f8 [16];
  undefined1 *local_29e8;
  qreal qStack_29e0;
  anon_union_24_3_e3d07ef4_for_data local_29d0 [5];
  QTextOption local_2958 [2];
  byte local_2928;
  LayoutData local_28c8 [72];
  long local_38;
  uint uVar11;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((uint)tf >> 9 & 1) == 0) && (_r->h <= 0.0 || _r->w <= 0.0)) {
    if (brect == (QRectF *)0x0) goto LAB_003d8d96;
    tf = tf | 0x4000;
  }
  if (option != (QTextOption *)0x0) {
    uVar9 = *(uint *)option & 0x1ff | tf;
    uVar17 = uVar9 | 0x1000;
    if ((*(uint *)option & 0x1e00) == 0) {
      uVar17 = uVar9;
    }
    if (0.0 <= option->tab) {
      tf = uVar17 | 0x400;
    }
    else {
      QTextOption::tabArray((QList<double> *)local_29d0,option);
      if ((QArrayData *)local_29d0[0]._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_29d0[0]._0_8_ = *(int *)local_29d0[0]._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_29d0[0]._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_29d0[0]._0_8_,8,0x10);
        }
      }
      tf = uVar17 | 0x400;
      if (local_29d0[0]._16_8_ == 0) {
        tf = uVar17;
      }
    }
  }
  local_2a18.xp = _r->xp;
  local_2a18.yp = _r->yp;
  local_2a18.w = _r->w;
  local_2a18.h = _r->h;
  uVar17 = 0;
  if ((((uint)tf >> 0x11 & 1) == 0) && (uVar17 = 1, ((uint)tf >> 0x12 & 1) == 0)) {
    if (option == (QTextOption *)0x0) {
      uVar17 = 0;
      if (painter != (QPainter *)0x0) {
        _Var1._M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
        super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl =
             *(tuple<QPainterState_*,_std::default_delete<QPainterState>_> *)
              &(((painter->d_ptr)._M_t.
                 super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
                 super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
                 super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl)->state)._M_t;
        if ((__uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>)
            _Var1._M_t.super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>.
            super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<QPainterState,_std::default_delete<QPainterState>_>)0x0) {
          uVar17 = 2;
        }
        else {
          uVar17 = *(uint *)((long)_Var1._M_t.
                                   super__Tuple_impl<0UL,_QPainterState_*,_std::default_delete<QPainterState>_>
                                   .super__Head_base<0UL,_QPainterState_*,_false>._M_head_impl +
                            0x1b0);
        }
      }
    }
    else {
      uVar17 = *(uint *)option >> 0xe & 3;
    }
  }
  uVar11 = (uint)((tf & 0x1fU) == 0);
  uVar10 = uVar11 | tf;
  uVar9 = uVar10 ^ 3;
  if (uVar17 != 1) {
    uVar9 = uVar10;
  }
  if (uVar11 == 0 && (tf & 3U) == 0) {
    uVar9 = uVar10;
  }
  if ((tf & 0x10U) != 0) {
    uVar9 = uVar10;
  }
  if ((uVar9 >> 10 & 1) == 0) {
    bVar14 = 0;
  }
  else if ((uVar17 == 1) || (bVar14 = 1, (uVar9 & 1) == 0)) {
    bVar14 = (byte)((uVar9 & 2) >> 1) & uVar17 == 1;
  }
  uVar10 = uVar9 | 0x4000;
  if (painter != (QPainter *)0x0) {
    uVar10 = uVar9;
  }
  local_2a20.d.d.ptr = (QExplicitlySharedDataPointer<QFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetricsF::QFontMetricsF(&local_2a20,fnt);
  local_2a38 = &((str->d).d)->super_QArrayData;
  local_2a30 = (str->d).ptr;
  local_2a28 = (str->d).size;
  if (local_2a38 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_2a38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_2a38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2b3c = tabstops;
  iVar18 = 0;
  uVar9 = 0;
  do {
    uVar15 = (ulong)(int)uVar9;
    uVar16 = uVar15;
    if ((long)uVar15 < local_2a28) {
      do {
        cVar5 = local_2a30[uVar16];
        if ((cVar5 == L'\r') || ((cVar5 == L'\n' & (byte)((uint)tf >> 8)) != 0)) {
LAB_003d83bd:
          if ((local_2a38 == (QArrayData *)0x0) ||
             (1 < (((QArrayData *)&local_2a38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i))
          {
            QString::reallocData((longlong)&local_2a38,(AllocationOption)local_2a28);
          }
          local_2a30[uVar16] = L' ';
        }
        else if ((ushort)cVar5 < 0x26) {
          if (cVar5 == L'\t') {
            if (bVar14 == 0) goto LAB_003d83bd;
            if (tabarraylen == 0 && local_2b3c == 0) {
              qVar23 = QFontMetricsF::horizontalAdvance(&local_2a20,(QChar)0x78);
              local_2b3c = (int)((double)((ulong)(qVar23 * 8.0) & 0x8000000000000000 |
                                         0x3fe0000000000000) + qVar23 * 8.0);
            }
          }
          else if (cVar5 == L'\n') {
            if ((local_2a38 == (QArrayData *)0x0) ||
               (1 < (((QArrayData *)&local_2a38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i
               )) {
              QString::reallocData((longlong)&local_2a38,(AllocationOption)local_2a28);
            }
            local_2a30[uVar16] = L'\x2028';
          }
        }
        else if (cVar5 == L'&') {
          iVar18 = iVar18 + 1;
        }
        else if (cVar5 == L'\x9c') {
          bVar2 = true;
          goto LAB_003d842b;
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < local_2a28);
      bVar2 = false;
    }
    else {
      bVar2 = false;
      uVar16 = (ulong)uVar9;
    }
LAB_003d842b:
    uVar11 = (uint)uVar16;
    iVar21 = uVar11 - uVar9;
    local_2a58.d = (Data *)0x0;
    local_2a58.ptr = (FormatRange *)0x0;
    local_2a58.size = 0;
    if ((tf & 0x8000U) == 0) {
      if (((byte)((uint)tf >> 0xb) & iVar18 != 0) != 0) {
LAB_003d8481:
        if ((local_2a38 == (QArrayData *)0x0) ||
           (1 < (((QArrayData *)&local_2a38->ref_)->ref_)._q_value.super___atomic_base<int>._M_i)) {
          QString::reallocData((longlong)&local_2a38,(AllocationOption)local_2a28);
        }
        if (iVar21 != 0) {
          pcVar13 = local_2a30 + uVar15;
          lVar20 = 0;
          pcVar19 = pcVar13;
          do {
            cVar5 = *pcVar19;
            if (cVar5 == L'&') {
              iVar21 = iVar21 + -1;
              if (iVar21 == 0) break;
              pcVar19 = pcVar19 + 1;
              cVar5 = *pcVar19;
              if (((uVar10 & 0x4000) == 0 && (tf & 0x8000U) == 0) && (cVar5 != L'&')) {
                local_29e8 = &DAT_aaaaaaaaaaaaaaaa;
                local_29f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                local_29f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
                QTextCharFormat::QTextCharFormat((QTextCharFormat *)(local_29f8 + 8));
                local_29f8._4_4_ = 1;
                local_29f8._0_4_ = (int)lVar20;
                QVariant::QVariant((QVariant *)local_29d0,1);
                QTextFormat::setProperty
                          ((QTextFormat *)(local_29f8 + 8),0x2023,(QVariant *)local_29d0);
                QVariant::~QVariant((QVariant *)local_29d0);
                QtPrivate::QMovableArrayOps<QTextLayout::FormatRange>::
                emplace<QTextLayout::FormatRange_const&>
                          ((QMovableArrayOps<QTextLayout::FormatRange> *)&local_2a58,local_2a58.size
                           ,(FormatRange *)local_29f8);
                QList<QTextLayout::FormatRange>::end((QList<QTextLayout::FormatRange> *)&local_2a58)
                ;
                QTextFormat::~QTextFormat((QTextFormat *)(local_29f8 + 8));
                cVar5 = *pcVar19;
              }
            }
            pcVar13[lVar20] = cVar5;
            pcVar19 = pcVar19 + 1;
            lVar20 = lVar20 + 1;
            iVar21 = iVar21 + -1;
          } while (iVar21 != 0);
        }
      }
    }
    else if (iVar18 != 0) goto LAB_003d8481;
    local_2a78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_2a78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_2a78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QString::mid((longlong)&local_2a78,(longlong)&local_2a38);
    QStackTextEngine::QStackTextEngine((QStackTextEngine *)local_29d0,&local_2a78,fnt);
    if (option != (QTextOption *)0x0) {
      QTextOption::operator=(local_2958,option);
    }
    if ((local_2958[0].tab < 0.0) && (0 < local_2b3c)) {
      local_2958[0].tab = (qreal)local_2b3c;
    }
    QTextOption::tabs((QList<QTextOption::Tab> *)local_29f8,local_2958);
    bVar22 = local_29e8 == (undefined1 *)0x0;
    if ((QArrayData *)local_29f8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_29f8._0_8_,0x10,0x10);
      }
    }
    if (ta != (int *)0x0 && bVar22) {
      local_29f8._0_8_ = (QArrayData *)0x0;
      local_29f8._8_8_ = (QTextFormatPrivate *)0x0;
      local_29e8 = (undefined1 *)0x0;
      QList<double>::reserve((QList<double> *)local_29f8,(long)tabarraylen);
      if (0 < tabarraylen) {
        uVar16 = 0;
        do {
          local_2a98._0_8_ = (BADTYPE)ta[uVar16];
          QtPrivate::QPodArrayOps<double>::emplace<double&>
                    ((QPodArrayOps<double> *)local_29f8,(qsizetype)local_29e8,(double *)&local_2a98)
          ;
          QList<double>::end((QList<double> *)local_29f8);
          uVar16 = uVar16 + 1;
        } while ((uint)tabarraylen != uVar16);
      }
      QTextOption::setTabArray(local_2958,(QList<double> *)local_29f8);
      if ((QArrayData *)local_29f8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_29f8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_29f8._0_8_,8,0x10);
        }
      }
    }
    uVar9 = 8;
    if ((uVar10 & 8) == 0) {
      uVar9 = 1;
    }
    uVar9 = uVar9 | (uVar17 & 3) << 0xe;
    uVar12 = uVar9 | local_2958[0]._0_4_ & 0xffff3e00;
    local_2958[0]._0_4_ = uVar9 | local_2958[0]._0_4_ & 0xffff2000 | 0x600;
    if ((uVar10 >> 0xd & 1) == 0) {
      local_2958[0]._0_4_ = uVar12;
    }
    if (option != (QTextOption *)0x0) {
      local_2958[0]._0_4_ = uVar12;
    }
    if ((uVar10 & 0x10000) != 0) {
      local_2928 = local_2928 | 8;
    }
    local_2a80.d = (QTextEngine *)local_29d0;
    QTextLayout::setCacheEnabled(&local_2a80,true);
    QTextLayout::setFormats(&local_2a80,(QList<QTextLayout::FormatRange> *)&local_2a58);
    if ((undefined1 *)local_2a78.d.size == (undefined1 *)0x0) {
      local_2b28 = QFontMetricsF::height(&local_2a20);
      uVar10 = uVar10 | 0x4000;
      puVar25 = (undefined1 *)0x0;
    }
    else {
      local_2b38 = 16777216.0;
      if (((uVar10 & 0x10000) != 0 || (tf & 0x3000U) != 0) &&
         (local_2b38 = local_2a18.w, local_2a18.w <= 0.0)) {
        local_2b38 = 0.0;
      }
      QTextLayout::beginLayout(&local_2a80);
      qVar23 = QFontMetricsF::leading(&local_2a20);
      local_2b28 = -qVar23;
      local_29f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_29f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QVar26 = QTextLayout::createLine(&local_2a80);
      local_29f8._0_4_ = QVar26.index;
      local_29f8._8_8_ = QVar26.eng;
      puVar3 = (undefined1 *)0x0;
      while (puVar25 = puVar3, (QTextEngine *)local_29f8._8_8_ != (QTextEngine *)0x0) {
        QTextLine::setLineWidth((QTextLine *)local_29f8,local_2b38);
        dVar24 = ceil(local_2b28 + qVar23);
        local_2a98._0_8_ = (undefined1 *)0x0;
        local_2a98.eng = (QTextEngine *)(double)(int)dVar24;
        QTextLine::setPosition((QTextLine *)local_29f8,(QPointF *)&local_2a98);
        lVar20 = (long)(int)local_29f8._0_4_;
        pQVar8 = QList<QScriptLine>::data(&(local_2a80.d)->lines);
        uVar9 = pQVar8[lVar20].leading.val;
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        local_2b28 = (double)(int)((*(int *)&pQVar8[lVar20].field_0x28 >> 0x1f & uVar9) +
                                  pQVar8[lVar20].ascent.val + pQVar8[lVar20].descent.val) * 0.015625
                     + (double)(int)dVar24;
        puVar25 = (undefined1 *)QTextLine::naturalTextWidth((QTextLine *)local_29f8);
        if ((double)puVar25 <= (double)puVar3) {
          puVar25 = puVar3;
        }
        if ((byte)(local_2b28 < local_2a18.h | brect != (QRectF *)0x0 | (byte)((uint)tf >> 9) & 1)
            != 1) break;
        local_29f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_29f8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QVar26 = QTextLayout::createLine(&local_2a80);
        local_29f8._0_4_ = QVar26.index;
        puVar3 = puVar25;
        local_29f8._8_8_ = QVar26.eng;
      }
      QTextLayout::endLayout(&local_2a80);
    }
    if ((uVar10 & 0x40) == 0) {
      local_2b18 = 0.0;
      if ((char)uVar10 < '\0') {
        local_2b18 = (local_2a18.h - local_2b28) * 0.5;
      }
    }
    else {
      local_2b18 = local_2a18.h - local_2b28;
    }
    if ((uVar10 & 2) == 0) {
      dVar24 = 0.0;
      if ((uVar10 & 4) != 0) {
        dVar24 = (local_2a18.w - (double)puVar25) * 0.5;
      }
    }
    else {
      dVar24 = local_2a18.w - (double)puVar25;
    }
    local_29f8._0_8_ = dVar24 + local_2a18.xp;
    local_29f8._8_8_ = local_2b18 + local_2a18.yp;
    qStack_29e0 = local_2b28;
    local_29e8 = puVar25;
    if ((bVar2 && (uVar10 >> 0x13 & 1) == 0) &&
       (cVar4 = QRectF::contains(&local_2a18), cVar4 == '\0')) {
      uVar9 = uVar11 + 1;
      bVar2 = true;
    }
    else {
      if (brect != (QRectF *)0x0) {
        brect->w = (qreal)local_29e8;
        brect->h = qStack_29e0;
        brect->xp = (qreal)local_29f8._0_8_;
        brect->yp = (qreal)local_29f8._8_8_;
      }
      uVar9 = uVar11;
      if ((uVar10 >> 0xe & 1) == 0) {
        if ((((uint)tf >> 9 & 1) == 0) && (cVar4 = QRectF::contains(&local_2a18), cVar4 == '\0')) {
          QPainter::save(painter);
          QPainter::setClipRect(painter,&local_2a18,IntersectClip);
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        iVar21 = QTextLayout::lineCount(&local_2a80);
        if (0 < iVar21) {
          iVar21 = 0;
          do {
            local_2a98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_2a98.eng = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
            QVar26 = QTextLayout::lineAt(&local_2a80,iVar21);
            this.d = local_2a80.d;
            local_2a98.eng = QVar26.eng;
            local_2a98.index = QVar26.index;
            (local_2a80.d)->field_0xa8 = (local_2a80.d)->field_0xa8 | 0x20;
            qVar23 = QTextLine::horizontalAdvance(&local_2a98);
            if ((uVar10 & 2) == 0) {
              local_2aa8.xp = 0.0;
              if ((uVar10 & 4) != 0) {
                local_2aa8.xp = (local_2a18.w - qVar23) * 0.5;
              }
            }
            else {
              dVar24 = local_2a18.w - qVar23;
              lVar20 = (long)local_2a98.index;
              pQVar8 = QList<QScriptLine>::data(&(this.d)->lines);
              QVar6 = QTextEngine::leadingSpaceWidth(this.d,pQVar8 + lVar20);
              local_2aa8.xp = (double)QVar6.val * -0.015625 + dVar24;
            }
            local_2aa8.xp = local_2aa8.xp + local_2a18.xp;
            local_2aa8.yp = local_2b18 + local_2a18.yp;
            QTextLine::draw(&local_2a98,painter,&local_2aa8);
            QTextEngine::drawDecorations(this.d,painter);
            iVar21 = iVar21 + 1;
            iVar7 = QTextLayout::lineCount(&local_2a80);
          } while (iVar21 < iVar7);
        }
        if (bVar2) {
          QPainter::restore(painter);
        }
        bVar2 = false;
      }
      else {
        bVar2 = false;
      }
    }
    QTextLayout::~QTextLayout(&local_2a80);
    QTextEngine::LayoutData::~LayoutData(local_28c8);
    QTextEngine::~QTextEngine((QTextEngine *)local_29d0);
    if (&(local_2a78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2a78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2a78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_2a78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_2a78.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_2a58);
  } while (bVar2);
  if (local_2a38 != (QArrayData *)0x0) {
    LOCK();
    (local_2a38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_2a38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_2a38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_2a38,2,0x10);
    }
  }
  QFontMetricsF::~QFontMetricsF(&local_2a20);
LAB_003d8d96:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_format_text(const QFont &fnt, const QRectF &_r,
                    int tf, const QTextOption *option, const QString& str, QRectF *brect,
                    int tabstops, int *ta, int tabarraylen,
                    QPainter *painter)
{

    Q_ASSERT( !((tf & ~Qt::TextDontPrint)!=0 && option!=nullptr) ); // we either have an option or flags

    if (_r.isEmpty() && !(tf & Qt::TextDontClip)) {
        if (!brect)
            return;
        else
            tf |= Qt::TextDontPrint;
    }

    if (option) {
        tf |= option->alignment();
        if (option->wrapMode() != QTextOption::NoWrap)
            tf |= Qt::TextWordWrap;

        if (option->flags() & QTextOption::IncludeTrailingSpaces)
            tf |= Qt::TextIncludeTrailingSpaces;

        if (option->tabStopDistance() >= 0 || !option->tabArray().isEmpty())
            tf |= Qt::TextExpandTabs;
    }

    // we need to copy r here to protect against the case (&r == brect).
    QRectF r(_r);

    bool dontclip  = (tf & Qt::TextDontClip);
    bool wordwrap  = (tf & Qt::TextWordWrap) || (tf & Qt::TextWrapAnywhere);
    bool singleline = (tf & Qt::TextSingleLine);
    bool showmnemonic = (tf & Qt::TextShowMnemonic);
    bool hidemnmemonic = (tf & Qt::TextHideMnemonic);

    Qt::LayoutDirection layout_direction;
    if (tf & Qt::TextForceLeftToRight)
        layout_direction = Qt::LeftToRight;
    else if (tf & Qt::TextForceRightToLeft)
        layout_direction = Qt::RightToLeft;
    else if (option)
        layout_direction = option->textDirection();
    else if (painter)
        layout_direction = painter->layoutDirection();
    else
        layout_direction = Qt::LeftToRight;

    tf = QGuiApplicationPrivate::visualAlignment(layout_direction, QFlag(tf));

    bool isRightToLeft = layout_direction == Qt::RightToLeft;
    bool expandtabs = ((tf & Qt::TextExpandTabs) &&
                        (((tf & Qt::AlignLeft) && !isRightToLeft) ||
                          ((tf & Qt::AlignRight) && isRightToLeft)));

    if (!painter)
        tf |= Qt::TextDontPrint;

    uint maxUnderlines = 0;

    QFontMetricsF fm(fnt);
    QString text = str;
    int offset = 0;
start_lengthVariant:
    bool hasMoreLengthVariants = false;
    // compatible behaviour to the old implementation. Replace
    // tabs by spaces
    int old_offset = offset;
    for (; offset < text.size(); offset++) {
        QChar chr = text.at(offset);
        if (chr == u'\r' || (singleline && chr == u'\n')) {
            text[offset] = u' ';
        } else if (chr == u'\n') {
            text[offset] = QChar::LineSeparator;
        } else if (chr == u'&') {
            ++maxUnderlines;
        } else if (chr == u'\t') {
            if (!expandtabs) {
                text[offset] = u' ';
            } else if (!tabarraylen && !tabstops) {
                tabstops = qRound(fm.horizontalAdvance(u'x')*8);
            }
        } else if (chr == u'\x9c') {
            // string with multiple length variants
            hasMoreLengthVariants = true;
            break;
        }
    }

    QList<QTextLayout::FormatRange> underlineFormats;
    int length = offset - old_offset;
    if ((hidemnmemonic || showmnemonic) && maxUnderlines > 0) {
        QChar *cout = text.data() + old_offset;
        QChar *cout0 = cout;
        QChar *cin = cout;
        int l = length;
        while (l) {
            if (*cin == u'&') {
                ++cin;
                --length;
                --l;
                if (!l)
                    break;
                if (*cin != u'&' && !hidemnmemonic && !(tf & Qt::TextDontPrint)) {
                    QTextLayout::FormatRange range;
                    range.start = cout - cout0;
                    range.length = 1;
                    range.format.setFontUnderline(true);
                    underlineFormats.append(range);
                }
#ifdef Q_OS_MAC
            } else if (hidemnmemonic && *cin == u'(' && l >= 4 &&
                       cin[1] == u'&' && cin[2] != u'&' &&
                       cin[3] == u')') {
                int n = 0;
                while ((cout - n) > cout0 && (cout - n - 1)->isSpace())
                    ++n;
                cout -= n;
                cin += 4;
                length -= n + 4;
                l -= 4;
                continue;
#endif //Q_OS_MAC
            }
            *cout = *cin;
            ++cout;
            ++cin;
            --l;
        }
    }

    qreal height = 0;
    qreal width = 0;

    QString finalText = text.mid(old_offset, length);
    Q_DECL_UNINITIALIZED QStackTextEngine engine(finalText, fnt);
    if (option) {
        engine.option = *option;
    }

    if (engine.option.tabStopDistance() < 0 && tabstops > 0)
        engine.option.setTabStopDistance(tabstops);

    if (engine.option.tabs().isEmpty() && ta) {
        QList<qreal> tabs;
        tabs.reserve(tabarraylen);
        for (int i = 0; i < tabarraylen; i++)
            tabs.append(qreal(ta[i]));
        engine.option.setTabArray(tabs);
    }

    engine.option.setTextDirection(layout_direction);
    if (tf & Qt::AlignJustify)
        engine.option.setAlignment(Qt::AlignJustify);
    else
        engine.option.setAlignment(Qt::AlignLeft); // do not do alignment twice

    if (!option && (tf & Qt::TextWrapAnywhere))
        engine.option.setWrapMode(QTextOption::WrapAnywhere);

    if (tf & Qt::TextJustificationForced)
        engine.forceJustification = true;
    QTextLayout textLayout(&engine);
    textLayout.setCacheEnabled(true);
    textLayout.setFormats(underlineFormats);

    if (finalText.isEmpty()) {
        height = fm.height();
        width = 0;
        tf |= Qt::TextDontPrint;
    } else {
        qreal lineWidth = 0x01000000;
        if (wordwrap || (tf & Qt::TextJustificationForced))
            lineWidth = qMax<qreal>(0, r.width());
        if (!wordwrap)
            tf |= Qt::TextIncludeTrailingSpaces;
        textLayout.beginLayout();

        qreal leading = fm.leading();
        height = -leading;

        while (1) {
            QTextLine l = textLayout.createLine();
            if (!l.isValid())
                break;

            l.setLineWidth(lineWidth);
            height += leading;

            // Make sure lines are positioned on whole pixels
            height = qCeil(height);
            l.setPosition(QPointF(0., height));
            height += textLayout.engine()->lines[l.lineNumber()].height().toReal();
            width = qMax(width, l.naturalTextWidth());
            if (!dontclip && !brect && height >= r.height())
                break;
        }
        textLayout.endLayout();
    }

    qreal yoff = 0;
    qreal xoff = 0;
    if (tf & Qt::AlignBottom)
        yoff = r.height() - height;
    else if (tf & Qt::AlignVCenter)
        yoff = (r.height() - height)/2;

    if (tf & Qt::AlignRight)
        xoff = r.width() - width;
    else if (tf & Qt::AlignHCenter)
        xoff = (r.width() - width)/2;

    QRectF bounds = QRectF(r.x() + xoff, r.y() + yoff, width, height);

    if (hasMoreLengthVariants && !(tf & Qt::TextLongestVariant) && !r.contains(bounds)) {
        offset++;
        goto start_lengthVariant;
    }
    if (brect)
        *brect = bounds;

    if (!(tf & Qt::TextDontPrint)) {
        bool restore = false;
        if (!dontclip && !r.contains(bounds)) {
            restore = true;
            painter->save();
            painter->setClipRect(r, Qt::IntersectClip);
        }

        for (int i = 0; i < textLayout.lineCount(); i++) {
            QTextLine line = textLayout.lineAt(i);
            QTextEngine *eng = textLayout.engine();
            eng->enableDelayDecorations();

            qreal advance = line.horizontalAdvance();
            xoff = 0;
            if (tf & Qt::AlignRight) {
                xoff = r.width() - advance -
                    eng->leadingSpaceWidth(eng->lines[line.lineNumber()]).toReal();
            }
            else if (tf & Qt::AlignHCenter)
                xoff = (r.width() - advance) / 2;

            line.draw(painter, QPointF(r.x() + xoff, r.y() + yoff));
            eng->drawDecorations(painter);
        }

        if (restore) {
            painter->restore();
        }
    }
}